

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_mark_verify(REF_SUBDIV ref_subdiv)

{
  REF_GRID pRVar1;
  REF_CELL pRVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  FILE *file;
  REF_INT map;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_GRID ref_grid;
  REF_SUBDIV ref_subdiv_local;
  
  pRVar1 = ref_subdiv->grid;
  __stream = fopen("ref_subdiv_verify.tec","w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n","ref_subdiv_verify.tec");
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x8c8,
           "ref_subdiv_mark_verify","unable to open file");
    ref_subdiv_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"tecplot refine scalar file\"\n");
    fprintf(__stream,"variables = \"x\" \"y\" \"z\" \"s\"\n");
    pRVar2 = pRVar1->cell[8];
    for (file._4_4_ = 0; (int)file._4_4_ < pRVar2->max; file._4_4_ = file._4_4_ + 1) {
      if ((((((-1 < (int)file._4_4_) && ((int)file._4_4_ < pRVar2->max)) &&
            (pRVar2->c2n[(int)(pRVar2->size_per * file._4_4_)] != -1)) &&
           (((uVar3 = ref_subdiv_map(ref_subdiv,pRVar2,file._4_4_), 2 < uVar3 && (uVar3 != 4)) &&
            ((uVar3 != 8 && ((uVar3 != 0xb && (uVar3 != 0x10)))))))) && (uVar3 != 0x15)) &&
         ((((uVar3 != 0x20 && (uVar3 != 0x26)) && (uVar3 != 0x38)) && (uVar3 != 0x3f)))) {
        uVar4 = ref_subdiv_map_to_edge(uVar3);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x8df,"ref_subdiv_mark_verify",(ulong)uVar4,"map2edge");
          return uVar4;
        }
        printf("tet %d, map %d\n",(ulong)file._4_4_,(ulong)uVar3);
        uVar3 = ref_subdiv_tec_zone(ref_subdiv,pRVar2,file._4_4_,(FILE *)__stream);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x8e1,"ref_subdiv_mark_verify",(ulong)uVar3,"zone");
          return uVar3;
        }
      }
    }
    pRVar2 = pRVar1->cell[9];
    for (file._4_4_ = 0; (int)file._4_4_ < pRVar2->max; file._4_4_ = file._4_4_ + 1) {
      if ((((-1 < (int)file._4_4_) && ((int)file._4_4_ < pRVar2->max)) &&
          (((pRVar2->c2n[(int)(pRVar2->size_per * file._4_4_)] != -1 &&
            ((uVar3 = ref_subdiv_map(ref_subdiv,pRVar2,file._4_4_), uVar3 != 0 && (uVar3 != 0x14))))
           && (uVar3 != 0x22)))) &&
         ((((uVar3 != 0x48 && (uVar3 != 0x5c)) && (uVar3 != 0x81)) &&
          (((uVar3 != 0x8b && (uVar3 != 0xe1)) && (uVar3 != 0xeb)))))) {
        uVar4 = ref_subdiv_map_to_edge(uVar3);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x8f4,"ref_subdiv_mark_verify",(ulong)uVar4,"map2edge");
          return uVar4;
        }
        printf("pyr %d, map %d\n",(ulong)file._4_4_,(ulong)uVar3);
        uVar3 = ref_subdiv_tec_zone(ref_subdiv,pRVar2,file._4_4_,(FILE *)__stream);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x8f6,"ref_subdiv_mark_verify",(ulong)uVar3,"zone");
          return uVar3;
        }
      }
    }
    pRVar2 = pRVar1->cell[10];
    for (file._4_4_ = 0; (int)file._4_4_ < pRVar2->max; file._4_4_ = file._4_4_ + 1) {
      if (((-1 < (int)file._4_4_) && ((int)file._4_4_ < pRVar2->max)) &&
         (((pRVar2->c2n[(int)(pRVar2->size_per * file._4_4_)] != -1 &&
           (((uVar3 = ref_subdiv_map(ref_subdiv,pRVar2,file._4_4_), uVar3 != 0 && (uVar3 != 0x41))
            && (uVar3 != 0x82)))) && ((uVar3 != 0x108 && (uVar3 != 0x1cb)))))) {
        uVar4 = ref_subdiv_map_to_edge(uVar3);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x905,"ref_subdiv_mark_verify",(ulong)uVar4,"map2edge");
          return uVar4;
        }
        printf("pri %d, map %d\n",(ulong)file._4_4_,(ulong)uVar3);
        uVar3 = ref_subdiv_tec_zone(ref_subdiv,pRVar2,file._4_4_,(FILE *)__stream);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x907,"ref_subdiv_mark_verify",(ulong)uVar3,"zone");
          return uVar3;
        }
      }
    }
    fclose(__stream);
    ref_subdiv_local._4_4_ = 0;
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_verify(REF_SUBDIV ref_subdiv) {
  REF_GRID ref_grid = ref_subdiv_grid(ref_subdiv);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT map;

  FILE *file;

  file = fopen("ref_subdiv_verify.tec", "w");
  if (NULL == (void *)file)
    printf("unable to open %s\n", "ref_subdiv_verify.tec");
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine scalar file\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"s\"\n");

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    switch (map) {
      case 0:
      case 1:
      case 2:
      case 4:
      case 8:
      case 16:
      case 32:
      case 11:
      case 56:
      case 38:
      case 21:
      case 63:
        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("tet %d, map %d\n", cell, map);
        RSS(ref_subdiv_tec_zone(ref_subdiv, ref_cell, cell, file), "zone");
    }
  }

  ref_cell = ref_grid_pyr(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    switch (map) {
      case 0:
      case 129:
      case 20:
      case 72:
      case 34:
      case 235:
      case 139:
      case 225:
      case 92:
        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pyr %d, map %d\n", cell, map);
        RSS(ref_subdiv_tec_zone(ref_subdiv, ref_cell, cell, file), "zone");
    }
  }

  ref_cell = ref_grid_pri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    switch (map) {
      case 0:
      case 65:
      case 130:
      case 264:
      case 459:
        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pri %d, map %d\n", cell, map);
        RSS(ref_subdiv_tec_zone(ref_subdiv, ref_cell, cell, file), "zone");
    }
  }

  fclose(file);

  return REF_SUCCESS;
}